

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perspective.h
# Opt level: O1

void __thiscall
phyr::PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,Transform *cameraToWorld,Bounds2f *screenBounds,double lensRadius
          ,double focalDistance,double fov,Film *film)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  uint uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  Transform local_128;
  
  Transform::perspective(&local_128,fov,0.009999999776482582,1000.0);
  ProjectiveCamera::ProjectiveCamera
            (&this->super_ProjectiveCamera,cameraToWorld,&local_128,screenBounds,lensRadius,
             focalDistance,film);
  (this->super_ProjectiveCamera).super_Camera._vptr_Camera = (_func_int **)&PTR__Camera_001acfd0;
  dVar1 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[0][0];
  dVar2 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[0][1];
  dVar3 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[1][0];
  dVar4 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[1][1];
  dVar5 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[2][0];
  dVar6 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[2][1];
  dVar21 = (double)(film->resolution).x;
  dVar24 = (double)(film->resolution).y;
  dVar14 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[0][2] * 0.0;
  dVar15 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[1][2] * 0.0;
  dVar16 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[0][3];
  dVar11 = dVar1 * 0.0 + dVar2 * 0.0 + dVar14 + dVar16;
  dVar18 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[2][2] * 0.0;
  dVar8 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[3][1];
  dVar9 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[3][0];
  dVar19 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[1][3];
  dVar12 = dVar3 * 0.0 + dVar4 * 0.0 + dVar15 + dVar19;
  dVar20 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[2][3];
  dVar13 = dVar5 * 0.0 + dVar6 * 0.0 + dVar18 + dVar20;
  dVar17 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[3][2] * 0.0;
  dVar23 = (this->super_ProjectiveCamera).rasterToCamera.mat.d[3][3];
  dVar22 = dVar23 + dVar17 + dVar21 * dVar9 + dVar24 * dVar8;
  dVar23 = dVar23 + dVar17 + dVar9 * 0.0 + dVar8 * 0.0;
  auVar7._8_8_ = -(ulong)(dVar23 == 1.0);
  auVar7._0_8_ = -(ulong)(dVar22 == 1.0);
  uVar10 = movmskpd(0x1acfd0,auVar7);
  if ((uVar10 & 2) == 0) {
    dVar23 = 1.0 / dVar23;
    dVar11 = dVar11 * dVar23;
    dVar12 = dVar12 * dVar23;
    dVar13 = dVar13 * dVar23;
  }
  dVar16 = dVar16 + dVar1 * dVar21 + dVar2 * dVar24 + dVar14;
  dVar19 = dVar19 + dVar3 * dVar21 + dVar4 * dVar24 + dVar15;
  dVar20 = dVar20 + dVar5 * dVar21 + dVar6 * dVar24 + dVar18;
  if ((uVar10 & 1) == 0) {
    dVar22 = 1.0 / dVar22;
    dVar16 = dVar16 * dVar22;
    dVar19 = dVar19 * dVar22;
    dVar20 = dVar20 * dVar22;
  }
  this->imagePlaneArea =
       ABS(((1.0 / dVar20) * dVar19 - dVar12 * (1.0 / dVar13)) *
           (dVar16 * (1.0 / dVar20) - dVar11 * (1.0 / dVar13)));
  return;
}

Assistant:

PerspectiveCamera(const Transform& cameraToWorld, const Bounds2f& screenBounds,
                      Real lensRadius, Real focalDistance, Real fov, Film* film) :
        ProjectiveCamera(cameraToWorld, Transform::perspective(fov, 1e-2f, 1000.0f),
                         screenBounds, lensRadius, focalDistance, film) {
        // Compute image plane bounds
        Point2i res = film->resolution;
        Point3f pMin = rasterToCamera(Point3f(0, 0, 0));
        Point3f pMax = rasterToCamera(Point3f(res.x, res.y, 0));

        // Z - divide
        pMin /= pMin.z; pMax /= pMax.z;
        imagePlaneArea = std::abs((pMax.x - pMin.x) * (pMax.y - pMin.y));
    }